

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.h
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer
          (TPZTransfer<std::complex<float>_> *this,TPZTransfer<std::complex<float>_> *cp)

{
  ulong uVar1;
  int *piVar2;
  int64_t iVar3;
  char cVar4;
  int *piVar5;
  complex<float> *__s;
  ulong uVar6;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_0182e710;
  iVar3 = (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow =
       (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = iVar3;
  cVar4 = (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = cVar4;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZTransfer_0182cf30;
  *(undefined4 *)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c =
       *(undefined4 *)&(cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c;
  TPZBlock::TPZBlock(&this->fRowBlock,&cp->fRowBlock);
  TPZBlock::TPZBlock(&this->fColBlock,&cp->fColBlock);
  TPZVec<int>::TPZVec(&this->fColPosition,&cp->fColPosition);
  TPZVec<int>::TPZVec(&this->fNumberofColumnBlocks,&cp->fNumberofColumnBlocks);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockPosition,0);
  (this->fColumnBlockNumber).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fColumnBlockNumber).super_TPZVec<int>.fNElements = 0;
  (this->fColumnBlockNumber).super_TPZVec<int>.fNAlloc = 0;
  (this->fColumnBlockNumber).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a018;
  uVar1 = (cp->fColumnBlockNumber).super_TPZVec<int>.fNElements;
  if ((long)uVar1 < 0xb) {
    piVar5 = (this->fColumnBlockNumber).fExtAlloc;
    (this->fColumnBlockNumber).super_TPZVec<int>.fStore = piVar5;
    (this->fColumnBlockNumber).super_TPZVec<int>.fNElements = uVar1;
    (this->fColumnBlockNumber).super_TPZVec<int>.fNAlloc = 0;
    if (0 < (long)uVar1) goto LAB_00ba545e;
  }
  else {
    piVar5 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    (this->fColumnBlockNumber).super_TPZVec<int>.fStore = piVar5;
    (this->fColumnBlockNumber).super_TPZVec<int>.fNElements = uVar1;
    (this->fColumnBlockNumber).super_TPZVec<int>.fNAlloc = uVar1;
LAB_00ba545e:
    piVar2 = (cp->fColumnBlockNumber).super_TPZVec<int>.fStore;
    uVar6 = 0;
    do {
      piVar5[uVar6] = piVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  this->fColumnBlockLastUsed = cp->fColumnBlockLastUsed;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore = (complex<float> *)0x0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a928;
  (this->fDoubleValues).fExtAlloc[0]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[1]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[2]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[3]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[4]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[5]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[6]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[7]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[8]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[9]._M_value = 0;
  uVar1 = (cp->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements;
  if ((long)uVar1 < 0xb) {
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore =
         (this->fDoubleValues).fExtAlloc;
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = uVar1;
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
    if ((long)uVar1 < 1) goto LAB_00ba556f;
  }
  else {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    memset(__s,0,uVar1 * 8);
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore = __s;
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = uVar1;
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = uVar1;
  }
  uVar6 = 0;
  do {
    (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore[uVar6]._M_value =
         (cp->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore[uVar6]._M_value;
    uVar6 = uVar6 + 1;
  } while (uVar1 != uVar6);
LAB_00ba556f:
  this->fDoubleValLastUsed = cp->fDoubleValLastUsed;
  return;
}

Assistant:

TPZTransfer(const TPZTransfer &cp) : TPZRegisterClassId(&TPZTransfer::ClassId),
    TPZMatrix<TVar>(cp),
	fNTVarVar(cp.fNTVarVar), fRowBlock(cp.fRowBlock),
	fColBlock(cp.fColBlock),fColPosition(cp.fColPosition),
	fNumberofColumnBlocks(cp.fNumberofColumnBlocks),
	fColumnBlockNumber(cp.fColumnBlockNumber),
	fColumnBlockLastUsed(cp.fColumnBlockLastUsed),
	fDoubleValues(cp.fDoubleValues),
	fDoubleValLastUsed(cp.fDoubleValLastUsed)
	{
	}